

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<char> * __thiscall
cimg_library::CImg<char>::get_crop
          (CImg<char> *__return_storage_ptr__,CImg<char> *this,int x0,int y0,int z0,int c0,int x1,
          int y1,int z1,int c1,uint boundary_conditions)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  CImg<char> *this_00;
  CImgInstanceException *this_01;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  char local_89;
  int local_88;
  undefined4 uStack_84;
  int local_80;
  undefined4 uStack_7c;
  
  if ((((this->_data != (char *)0x0) && (this->_width != 0)) && (this->_height != 0)) &&
     ((this->_depth != 0 && (this->_spectrum != 0)))) {
    uVar31 = x1;
    if (x0 < x1) {
      uVar31 = x0;
    }
    uVar26 = x1 ^ x0 ^ uVar31;
    uVar9 = y1;
    if (y0 < y1) {
      uVar9 = y0;
    }
    uVar32 = y1 ^ y0 ^ uVar9;
    uVar22 = z1;
    if (z0 < z1) {
      uVar22 = z0;
    }
    _local_80 = CONCAT44(uStack_7c,-uVar22);
    uVar19 = z1 ^ z0 ^ uVar22;
    uVar24 = c1;
    if (c0 < c1) {
      uVar24 = c0;
    }
    _local_88 = CONCAT44(uStack_84,-uVar24);
    uVar28 = c1 ^ c0 ^ uVar24;
    CImg(__return_storage_ptr__,(uVar26 - uVar31) + 1,(uVar32 - uVar9) + 1,(uVar19 - uVar22) + 1,
         (uVar28 - uVar24) + 1);
    if ((((int)uVar31 < 0) || ((int)uVar9 < 0)) ||
       (((int)this->_width <= (int)uVar26 ||
        (((((int)uVar22 < 0 || ((int)this->_height <= (int)uVar32)) || ((int)uVar24 < 0)) ||
         (((int)this->_depth <= (int)uVar19 || ((int)this->_spectrum <= (int)uVar28)))))))) {
      if (boundary_conditions == 3) {
        if (0 < (int)__return_storage_ptr__->_spectrum) {
          iVar5 = this->_width * 2;
          iVar6 = this->_height * 2;
          iVar7 = this->_depth * 2;
          iVar8 = this->_spectrum * 2;
          lVar15 = 0;
          do {
            if (0 < (int)__return_storage_ptr__->_depth) {
              uVar11 = (int)uVar24 + lVar15;
              lVar14 = 0;
              do {
                if (0 < (int)__return_storage_ptr__->_height) {
                  uVar13 = (int)uVar22 + lVar14;
                  lVar20 = 0;
                  do {
                    uVar17 = (ulong)__return_storage_ptr__->_width;
                    if (0 < (int)__return_storage_ptr__->_width) {
                      uVar23 = lVar20 + (int)uVar9;
                      uVar26 = (uint)((long)((ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 |
                                            uVar23 & 0xffffffff) % (long)iVar6);
                      uVar32 = uVar26 + iVar6;
                      if (uVar26 == 0) {
                        uVar32 = uVar26;
                      }
                      if (-1 < (long)uVar23) {
                        uVar32 = uVar26;
                      }
                      uVar26 = (uint)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 |
                                            uVar13 & 0xffffffff) % (long)iVar7);
                      uVar19 = uVar26 + iVar7;
                      if (uVar26 == 0) {
                        uVar19 = uVar26;
                      }
                      if (-1 < (long)uVar13) {
                        uVar19 = uVar26;
                      }
                      uVar28 = (uint)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                            uVar11 & 0xffffffff) % (long)iVar8);
                      uVar26 = uVar28 + iVar8;
                      if (uVar28 == 0) {
                        uVar26 = uVar28;
                      }
                      if (-1 < (long)uVar11) {
                        uVar26 = uVar28;
                      }
                      lVar29 = 0;
                      uVar23 = (long)(int)uVar31;
                      do {
                        uVar18 = (uint)((long)((ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 |
                                              uVar23 & 0xffffffff) % (long)iVar5);
                        uVar28 = uVar18 + iVar5;
                        if (uVar18 == 0) {
                          uVar28 = uVar18;
                        }
                        if (-1 < (long)uVar23) {
                          uVar28 = uVar18;
                        }
                        uVar18 = this->_width;
                        uVar2 = ~uVar28 + iVar5;
                        if ((int)uVar28 < (int)uVar18) {
                          uVar2 = uVar28;
                        }
                        uVar28 = ~uVar32 + iVar6;
                        if ((int)uVar32 < (int)this->_height) {
                          uVar28 = uVar32;
                        }
                        uVar3 = ~uVar19 + iVar7;
                        if ((int)uVar19 < (int)this->_depth) {
                          uVar3 = uVar19;
                        }
                        uVar4 = ~uVar26 + iVar8;
                        if ((int)uVar26 < (int)this->_spectrum) {
                          uVar4 = uVar26;
                        }
                        lVar25 = (ulong)this->_height * (ulong)uVar18;
                        __return_storage_ptr__->_data
                        [lVar29 + (((ulong)__return_storage_ptr__->_depth * lVar15 + lVar14) *
                                   (ulong)__return_storage_ptr__->_height + lVar20) *
                                  (uVar17 & 0xffffffff)] =
                             this->_data
                             [(ulong)uVar4 * (ulong)this->_depth * lVar25 +
                              (ulong)uVar3 * lVar25 + (ulong)uVar2 + (ulong)uVar28 * (ulong)uVar18];
                        lVar29 = lVar29 + 1;
                        uVar17 = (ulong)(int)__return_storage_ptr__->_width;
                        uVar23 = uVar23 + 1;
                      } while (lVar29 < (long)uVar17);
                    }
                    lVar20 = lVar20 + 1;
                  } while (lVar20 < (int)__return_storage_ptr__->_height);
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 < (int)__return_storage_ptr__->_depth);
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < (int)__return_storage_ptr__->_spectrum);
        }
      }
      else if (boundary_conditions == 2) {
        if (0 < (int)__return_storage_ptr__->_spectrum) {
          lVar15 = 0;
          do {
            if (0 < (int)__return_storage_ptr__->_depth) {
              uVar11 = (int)uVar24 + lVar15;
              lVar14 = 0;
              do {
                if (0 < (int)__return_storage_ptr__->_height) {
                  uVar13 = lVar14 + (int)uVar22;
                  lVar20 = 0;
                  do {
                    uVar17 = (ulong)__return_storage_ptr__->_width;
                    if (0 < (int)__return_storage_ptr__->_width) {
                      uVar12 = (int)uVar9 + lVar20;
                      lVar29 = 0;
                      uVar23 = (long)(int)uVar31;
                      do {
                        uVar26 = this->_width;
                        uVar32 = this->_height;
                        uVar1 = (long)((ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 |
                                      uVar23 & 0xffffffff) % (long)(int)uVar26;
                        uVar27 = (ulong)((int)uVar1 + uVar26);
                        if ((int)uVar1 == 0) {
                          uVar27 = uVar1 & 0xffffffff;
                        }
                        if (-1 < (long)uVar23) {
                          uVar27 = uVar1 & 0xffffffff;
                        }
                        uVar1 = (long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 |
                                      uVar12 & 0xffffffff) % (long)(int)uVar32;
                        uVar30 = (ulong)((int)uVar1 + uVar32);
                        if ((int)uVar1 == 0) {
                          uVar30 = uVar1 & 0xffffffff;
                        }
                        if (-1 < (long)uVar12) {
                          uVar30 = uVar1 & 0xffffffff;
                        }
                        uVar19 = this->_depth;
                        uVar1 = (long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 |
                                      uVar13 & 0xffffffff) % (long)(int)uVar19;
                        uVar16 = (ulong)((int)uVar1 + uVar19);
                        if ((int)uVar1 == 0) {
                          uVar16 = uVar1 & 0xffffffff;
                        }
                        if (-1 < (long)uVar13) {
                          uVar16 = uVar1 & 0xffffffff;
                        }
                        uVar1 = (long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                      uVar11 & 0xffffffff) % (long)(int)this->_spectrum;
                        uVar21 = (ulong)(this->_spectrum + (int)uVar1);
                        if ((int)uVar1 == 0) {
                          uVar21 = uVar1 & 0xffffffff;
                        }
                        if (-1 < (long)uVar11) {
                          uVar21 = uVar1 & 0xffffffff;
                        }
                        lVar25 = (ulong)uVar32 * (ulong)uVar26;
                        __return_storage_ptr__->_data
                        [lVar29 + (((ulong)__return_storage_ptr__->_depth * lVar15 + lVar14) *
                                   (ulong)__return_storage_ptr__->_height + lVar20) *
                                  (uVar17 & 0xffffffff)] =
                             this->_data
                             [lVar25 * (ulong)uVar19 * uVar21 +
                              uVar16 * lVar25 + uVar27 + uVar30 * uVar26];
                        lVar29 = lVar29 + 1;
                        uVar17 = (ulong)(int)__return_storage_ptr__->_width;
                        uVar23 = uVar23 + 1;
                      } while (lVar29 < (long)uVar17);
                    }
                    lVar20 = lVar20 + 1;
                  } while (lVar20 < (int)__return_storage_ptr__->_height);
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 < (int)__return_storage_ptr__->_depth);
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < (int)__return_storage_ptr__->_spectrum);
        }
      }
      else if (boundary_conditions == 1) {
        if (0 < (int)__return_storage_ptr__->_spectrum) {
          if (x1 < x0) {
            x0 = x1;
          }
          lVar15 = 0;
          do {
            if (0 < (int)__return_storage_ptr__->_depth) {
              lVar14 = 0;
              do {
                if (0 < (int)__return_storage_ptr__->_height) {
                  lVar20 = 0;
                  do {
                    if (0 < (int)__return_storage_ptr__->_width) {
                      lVar29 = 0;
                      do {
                        pcVar10 = _atXYZC(this,x0 + (int)lVar29,uVar9 + (int)lVar20,
                                          uVar22 + (int)lVar14,uVar24 + (int)lVar15);
                        __return_storage_ptr__->_data
                        [lVar29 + (((ulong)__return_storage_ptr__->_depth * lVar15 + lVar14) *
                                   (ulong)__return_storage_ptr__->_height + lVar20) *
                                  (ulong)__return_storage_ptr__->_width] = *pcVar10;
                        lVar29 = lVar29 + 1;
                      } while (lVar29 < (int)__return_storage_ptr__->_width);
                    }
                    lVar20 = lVar20 + 1;
                  } while (lVar20 < (int)__return_storage_ptr__->_height);
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 < (int)__return_storage_ptr__->_depth);
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < (int)__return_storage_ptr__->_spectrum);
        }
      }
      else {
        local_89 = '\0';
        this_00 = fill(__return_storage_ptr__,&local_89);
        draw_image(this_00,-uVar31,-uVar9,local_80,local_88,this,1.0);
      }
    }
    else {
      draw_image(__return_storage_ptr__,-uVar31,-uVar9,local_80,local_88,this,1.0);
    }
    return __return_storage_ptr__;
  }
  this_01 = (CImgInstanceException *)__cxa_allocate_exception(0x10);
  pcVar10 = "non-";
  if (this->_is_shared != false) {
    pcVar10 = "";
  }
  CImgInstanceException::CImgInstanceException
            (this_01,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::crop(): Empty instance.",
             (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar10,"char");
  __cxa_throw(this_01,&CImgInstanceException::typeinfo,CImgException::~CImgException);
}

Assistant:

CImg<T> get_crop(const int x0, const int y0, const int z0, const int c0,
                     const int x1, const int y1, const int z1, const int c1,
                     const unsigned int boundary_conditions=0) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "crop(): Empty instance.",
                                    cimg_instance);
      const int
        nx0 = x0<x1?x0:x1, nx1 = x0^x1^nx0,
        ny0 = y0<y1?y0:y1, ny1 = y0^y1^ny0,
        nz0 = z0<z1?z0:z1, nz1 = z0^z1^nz0,
        nc0 = c0<c1?c0:c1, nc1 = c0^c1^nc0;
      CImg<T> res(1U + nx1 - nx0,1U + ny1 - ny0,1U + nz1 - nz0,1U + nc1 - nc0);
      if (nx0<0 || nx1>=width() || ny0<0 || ny1>=height() || nz0<0 || nz1>=depth() || nc0<0 || nc1>=spectrum())
        switch (boundary_conditions) {
        case 3 : { // Mirror
          const int w2 = 2*width(), h2 = 2*height(), d2 = 2*depth(), s2 = 2*spectrum();
          cimg_pragma_openmp(parallel for cimg_openmp_collapse(3) cimg_openmp_if(_width>=(cimg_openmp_sizefactor)*16 &&
                                                                     _height*_depth*_spectrum>=4))
          cimg_forXYZC(res,x,y,z,c) {
            const int
              mx = cimg::mod(nx0 + x,w2),
              my = cimg::mod(ny0 + y,h2),
              mz = cimg::mod(nz0 + z,d2),
              mc = cimg::mod(nc0 + c,s2);
            res(x,y,z,c) = (*this)(mx<width()?mx:w2 - mx - 1,
                                   my<height()?my:h2 - my - 1,
                                   mz<depth()?mz:d2 - mz - 1,
                                   mc<spectrum()?mc:s2 - mc - 1);
          }
        } break;
        case 2 : { // Periodic
          cimg_pragma_openmp(parallel for cimg_openmp_collapse(3) cimg_openmp_if(_width>=(cimg_openmp_sizefactor)*16 &&
                                                                     _height*_depth*_spectrum>=4))
          cimg_forXYZC(res,x,y,z,c) {
            res(x,y,z,c) = (*this)(cimg::mod(nx0 + x,width()),cimg::mod(ny0 + y,height()),
                                   cimg::mod(nz0 + z,depth()),cimg::mod(nc0 + c,spectrum()));
          }
        } break;
        case 1 : // Neumann
          cimg_pragma_openmp(parallel for cimg_openmp_collapse(3) cimg_openmp_if(_width>=(cimg_openmp_sizefactor)*16 &&
                                                                     _height*_depth*_spectrum>=4))
          cimg_forXYZC(res,x,y,z,c) res(x,y,z,c) = _atXYZC(nx0 + x,ny0 + y,nz0 + z,nc0 + c);
          break;
        default : // Dirichlet
          res.fill((T)0).draw_image(-nx0,-ny0,-nz0,-nc0,*this);
        }
      else res.draw_image(-nx0,-ny0,-nz0,-nc0,*this);
      return res;
    }